

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::IfcSlab(IfcSlab *this)

{
  *(undefined ***)&this->field_0x180 = &PTR__Object_00816a50;
  *(undefined8 *)&this->field_0x188 = 0;
  *(char **)&this->field_0x190 = "IfcSlab";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__008bbc70);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8bbb40;
  *(undefined8 *)&this->field_0x180 = 0x8bbc58;
  *(undefined8 *)&this->field_0x88 = 0x8bbb68;
  *(undefined8 *)&this->field_0x98 = 0x8bbb90;
  *(undefined8 *)&this->field_0xd0 = 0x8bbbb8;
  *(undefined8 *)&this->field_0x100 = 0x8bbbe0;
  *(undefined8 *)&this->field_0x138 = 0x8bbc08;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x8bbc30;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x20 = 0;
  this->field_0x178 = 0;
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}